

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool __thiscall
cmInstallCommand::HandleExportMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmTargetExport *pcVar1;
  const_iterator exportSet_00;
  bool bVar2;
  uint uVar3;
  PolicyStatus PVar4;
  MessageLevel message_00;
  const_reference pvVar5;
  ostream *poVar6;
  reference pvVar7;
  ulong uVar8;
  string *psVar9;
  long lVar10;
  cmGlobalGenerator *this_00;
  cmExportSetMap *this_01;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *pvVar11;
  reference ppcVar12;
  cmInstallExportGenerator *this_02;
  char *destination;
  char *file_permissions;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  char *component;
  char *filename_00;
  char *name_space_00;
  bool local_10a9;
  cmInstallExportGenerator *exportGenerator;
  undefined1 local_1020 [4];
  MessageLevel message;
  undefined1 local_1000 [8];
  ostringstream e_5;
  bool newCMP0022Behavior;
  cmTargetExport *te;
  __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
  local_e70;
  const_iterator tei;
  cmExportSet *exportSet;
  undefined1 local_e40 [8];
  ostringstream e_4;
  string local_cc8;
  undefined1 local_ca8 [8];
  ostringstream e_3;
  string local_b28;
  string local_b08;
  undefined1 local_ae8 [8];
  ostringstream e_2;
  undefined1 local_970 [8];
  string fname;
  undefined1 local_930 [8];
  ostringstream e_1;
  string local_7b0;
  undefined1 local_790 [8];
  ostringstream e;
  undefined1 local_618 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  cmCAString filename;
  cmCAEnabler exportOld;
  cmCAString name_space;
  undefined1 local_4a8 [8];
  cmCAString exp;
  cmInstallCommandArguments ica;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmInstallCommand *this_local;
  
  ica.DefaultComponentName.field_2._8_8_ = args;
  cmInstallCommandArguments::cmInstallCommandArguments
            ((cmInstallCommandArguments *)&exp.DataStart,&this->DefaultComponentName);
  cmCAString::cmCAString
            ((cmCAString *)local_4a8,(cmCommandArgumentsHelper *)&exp.DataStart,"EXPORT",
             (cmCommandArgumentGroup *)0x0);
  cmCAString::cmCAString
            ((cmCAString *)&exportOld.Enabled,(cmCommandArgumentsHelper *)&exp.DataStart,"NAMESPACE"
             ,(cmCommandArgumentGroup *)
              &ica.Parser.Arguments.
               super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl
               .super__Vector_impl_data._M_end_of_storage);
  cmCAEnabler::cmCAEnabler
            ((cmCAEnabler *)&filename.DataStart,(cmCommandArgumentsHelper *)&exp.DataStart,
             "EXPORT_LINK_INTERFACE_LIBRARIES",
             (cmCommandArgumentGroup *)
             &ica.Parser.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cmCAString::cmCAString
            ((cmCAString *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (cmCommandArgumentsHelper *)&exp.DataStart,"FILE",
             (cmCommandArgumentGroup *)
             &ica.Parser.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cmCommandArgument::Follows((cmCommandArgument *)local_4a8,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows
            ((cmCommandArgumentGroup *)
             &ica.Parser.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(cmCommandArgument *)local_4a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_618);
  cmInstallCommandArguments::Parse
            ((cmInstallCommandArguments *)&exp.DataStart,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ica.DefaultComponentName.field_2._8_8_,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_618);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_618);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_790);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ica.DefaultComponentName.field_2._8_8_,0);
    poVar6 = std::operator<<((ostream *)local_790,(string *)pvVar5);
    poVar6 = std::operator<<(poVar6," given unknown argument \"");
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_618,0);
    poVar6 = std::operator<<(poVar6,(string *)pvVar7);
    std::operator<<(poVar6,"\".");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_7b0);
    std::__cxx11::string::~string((string *)&local_7b0);
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_790);
    goto LAB_00518dec;
  }
  bVar2 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)&exp.DataStart);
  if (!bVar2) {
    this_local._7_1_ = false;
    goto LAB_00518dec;
  }
  cmInstallCommandArguments::GetDestination_abi_cxx11_((cmInstallCommandArguments *)&exp.DataStart);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_930);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ica.DefaultComponentName.field_2._8_8_,0);
    poVar6 = std::operator<<((ostream *)local_930,(string *)pvVar5);
    std::operator<<(poVar6," given no DESTINATION!");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)((long)&fname.field_2 + 8));
    std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_930);
    goto LAB_00518dec;
  }
  psVar9 = cmCAString::GetString_abi_cxx11_
                     ((cmCAString *)
                      &unknownArgs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string((string *)local_970,(string *)psVar9);
  lVar10 = std::__cxx11::string::find_first_of(local_970,0x8d7b82);
  if (lVar10 == -1) {
    uVar3 = std::__cxx11::string::empty();
    local_10a9 = false;
    if ((uVar3 & 1) == 0) {
      cmsys::SystemTools::GetFilenameLastExtension(&local_b28,(string *)local_970);
      local_10a9 = std::operator!=(&local_b28,".cmake");
      std::__cxx11::string::~string((string *)&local_b28);
    }
    if (local_10a9 == false) {
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) != 0) {
        psVar9 = cmCAString::GetString_abi_cxx11_((cmCAString *)local_4a8);
        std::__cxx11::string::operator=((string *)local_970,(string *)psVar9);
        std::__cxx11::string::operator+=((string *)local_970,".cmake");
        lVar10 = std::__cxx11::string::find_first_of(local_970,0x8d7b82);
        if (lVar10 != -1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e40);
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)ica.DefaultComponentName.field_2._8_8_,0);
          poVar6 = std::operator<<((ostream *)local_e40,(string *)pvVar5);
          poVar6 = std::operator<<(poVar6," given export name \"");
          psVar9 = cmCAString::GetString_abi_cxx11_((cmCAString *)local_4a8);
          poVar6 = std::operator<<(poVar6,(string *)psVar9);
          poVar6 = std::operator<<(poVar6,"\".  ");
          poVar6 = std::operator<<(poVar6,"This name cannot be safely converted to a file name.  ");
          poVar6 = std::operator<<(poVar6,
                                   "Specify a different export name or use the FILE option to set ")
          ;
          std::operator<<(poVar6,"a file name explicitly.");
          std::__cxx11::ostringstream::str();
          cmCommand::SetError(&this->super_cmCommand,(string *)&exportSet);
          std::__cxx11::string::~string((string *)&exportSet);
          this_local._7_1_ = false;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e40);
          goto LAB_00518dd0;
        }
      }
      this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
      this_01 = cmGlobalGenerator::GetExportSets(this_00);
      psVar9 = cmCAString::GetString_abi_cxx11_((cmCAString *)local_4a8);
      tei._M_current = (cmTargetExport **)cmExportSetMap::operator[](this_01,psVar9);
      bVar2 = cmCAEnabler::IsEnabled((cmCAEnabler *)&filename.DataStart);
      if (bVar2) {
        pvVar11 = cmExportSet::GetTargetExports((cmExportSet *)tei._M_current);
        local_e70._M_current =
             (cmTargetExport **)
             std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin(pvVar11);
        while( true ) {
          pvVar11 = cmExportSet::GetTargetExports((cmExportSet *)tei._M_current);
          te = (cmTargetExport *)
               std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end(pvVar11);
          bVar2 = __gnu_cxx::operator!=
                            (&local_e70,
                             (__normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                              *)&te);
          if (!bVar2) break;
          ppcVar12 = __gnu_cxx::
                     __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                     ::operator*(&local_e70);
          pcVar1 = *ppcVar12;
          PVar4 = cmTarget::GetPolicyStatusCMP0022(pcVar1->Target);
          bVar2 = false;
          if (PVar4 != WARN) {
            PVar4 = cmTarget::GetPolicyStatusCMP0022(pcVar1->Target);
            bVar2 = PVar4 != OLD;
          }
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1000);
            poVar6 = std::operator<<((ostream *)local_1000,"INSTALL(EXPORT) given keyword \"");
            poVar6 = std::operator<<(poVar6,"EXPORT_LINK_INTERFACE_LIBRARIES");
            poVar6 = std::operator<<(poVar6,"\", but target \"");
            psVar9 = cmTarget::GetName_abi_cxx11_(pcVar1->Target);
            poVar6 = std::operator<<(poVar6,(string *)psVar9);
            std::operator<<(poVar6,"\" does not have policy CMP0022 set to NEW.");
            std::__cxx11::ostringstream::str();
            cmCommand::SetError(&this->super_cmCommand,(string *)local_1020);
            std::__cxx11::string::~string((string *)local_1020);
            this_local._7_1_ = false;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1000);
            goto LAB_00518dd0;
          }
          __gnu_cxx::
          __normal_iterator<cmTargetExport_*const_*,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
          ::operator++(&local_e70);
        }
      }
      message_00 = cmInstallGenerator::SelectMessageLevel((this->super_cmCommand).Makefile,false);
      this_02 = (cmInstallExportGenerator *)operator_new(0x178);
      exportSet_00 = tei;
      cmInstallCommandArguments::GetDestination_abi_cxx11_
                ((cmInstallCommandArguments *)&exp.DataStart);
      destination = (char *)std::__cxx11::string::c_str();
      cmInstallCommandArguments::GetPermissions_abi_cxx11_
                ((cmInstallCommandArguments *)&exp.DataStart);
      file_permissions = (char *)std::__cxx11::string::c_str();
      configurations =
           cmInstallCommandArguments::GetConfigurations_abi_cxx11_
                     ((cmInstallCommandArguments *)&exp.DataStart);
      cmInstallCommandArguments::GetComponent_abi_cxx11_
                ((cmInstallCommandArguments *)&exp.DataStart);
      component = (char *)std::__cxx11::string::c_str();
      filename_00 = (char *)std::__cxx11::string::c_str();
      name_space_00 = cmCAString::GetCString((cmCAString *)&exportOld.Enabled);
      bVar2 = cmCAEnabler::IsEnabled((cmCAEnabler *)&filename.DataStart);
      cmInstallExportGenerator::cmInstallExportGenerator
                (this_02,(cmExportSet *)exportSet_00._M_current,destination,file_permissions,
                 configurations,component,message_00,filename_00,name_space_00,bVar2,
                 (this->super_cmCommand).Makefile);
      cmMakefile::AddInstallGenerator
                ((this->super_cmCommand).Makefile,(cmInstallGenerator *)this_02);
      this_local._7_1_ = true;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ca8);
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)ica.DefaultComponentName.field_2._8_8_,0);
      poVar6 = std::operator<<((ostream *)local_ca8,(string *)pvVar5);
      poVar6 = std::operator<<(poVar6," given invalid export file name \"");
      poVar6 = std::operator<<(poVar6,(string *)local_970);
      poVar6 = std::operator<<(poVar6,"\".  ");
      std::operator<<(poVar6,"The FILE argument must specify a name ending in \".cmake\".");
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(&this->super_cmCommand,&local_cc8);
      std::__cxx11::string::~string((string *)&local_cc8);
      this_local._7_1_ = false;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ca8);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ae8);
    pvVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)ica.DefaultComponentName.field_2._8_8_,0);
    poVar6 = std::operator<<((ostream *)local_ae8,(string *)pvVar5);
    poVar6 = std::operator<<(poVar6," given invalid export file name \"");
    poVar6 = std::operator<<(poVar6,(string *)local_970);
    poVar6 = std::operator<<(poVar6,"\".  ");
    poVar6 = std::operator<<(poVar6,"The FILE argument may not contain a path.  ");
    std::operator<<(poVar6,"Specify the path in the DESTINATION argument.");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_b08);
    std::__cxx11::string::~string((string *)&local_b08);
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ae8);
  }
LAB_00518dd0:
  std::__cxx11::string::~string((string *)local_970);
LAB_00518dec:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_618);
  cmCAString::~cmCAString
            ((cmCAString *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmCAEnabler::~cmCAEnabler((cmCAEnabler *)&filename.DataStart);
  cmCAString::~cmCAString((cmCAString *)&exportOld.Enabled);
  cmCAString::~cmCAString((cmCAString *)local_4a8);
  cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)&exp.DataStart)
  ;
  return this_local._7_1_;
}

Assistant:

bool cmInstallCommand::HandleExportMode(std::vector<std::string> const& args)
{
  // This is the EXPORT mode.
  cmInstallCommandArguments ica(this->DefaultComponentName);
  cmCAString exp(&ica.Parser, "EXPORT");
  cmCAString name_space(&ica.Parser, "NAMESPACE", &ica.ArgumentGroup);
  cmCAEnabler exportOld(&ica.Parser, "EXPORT_LINK_INTERFACE_LIBRARIES",
                        &ica.ArgumentGroup);
  cmCAString filename(&ica.Parser, "FILE", &ica.ArgumentGroup);
  exp.Follows(0);

  ica.ArgumentGroup.Follows(&exp);
  std::vector<std::string> unknownArgs;
  ica.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty())
    {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
    }

  if (!ica.Finalize())
    {
    return false;
    }

  // Make sure there is a destination.
  if(ica.GetDestination().empty())
    {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
    }

  // Check the file name.
  std::string fname = filename.GetString();
  if(fname.find_first_of(":/\\") != fname.npos)
    {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument may not contain a path.  "
      << "Specify the path in the DESTINATION argument.";
    this->SetError(e.str());
    return false;
    }

  // Check the file extension.
  if(!fname.empty() &&
     cmSystemTools::GetFilenameLastExtension(fname) != ".cmake")
    {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument must specify a name ending in \".cmake\".";
    this->SetError(e.str());
    return false;
    }

  // Construct the file name.
  if(fname.empty())
    {
    fname = exp.GetString();
    fname += ".cmake";

    if(fname.find_first_of(":/\\") != fname.npos)
      {
      std::ostringstream e;
      e << args[0] << " given export name \"" << exp.GetString() << "\".  "
        << "This name cannot be safely converted to a file name.  "
        << "Specify a different export name or use the FILE option to set "
        << "a file name explicitly.";
      this->SetError(e.str());
      return false;
      }
    }

  cmExportSet *exportSet = this->Makefile->GetGlobalGenerator()
                                         ->GetExportSets()[exp.GetString()];
  if (exportOld.IsEnabled())
    {
    for(std::vector<cmTargetExport*>::const_iterator
          tei = exportSet->GetTargetExports()->begin();
        tei != exportSet->GetTargetExports()->end(); ++tei)
      {
      cmTargetExport const* te = *tei;
      const bool newCMP0022Behavior =
                      te->Target->GetPolicyStatusCMP0022() != cmPolicies::WARN
                   && te->Target->GetPolicyStatusCMP0022() != cmPolicies::OLD;

      if(!newCMP0022Behavior)
        {
        std::ostringstream e;
        e << "INSTALL(EXPORT) given keyword \""
          << "EXPORT_LINK_INTERFACE_LIBRARIES" << "\", but target \""
          << te->Target->GetName()
          << "\" does not have policy CMP0022 set to NEW.";
        this->SetError(e.str());
        return false;
        }
      }
    }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile);

  // Create the export install generator.
  cmInstallExportGenerator* exportGenerator =
    new cmInstallExportGenerator(
      exportSet,
      ica.GetDestination().c_str(),
      ica.GetPermissions().c_str(), ica.GetConfigurations(),
      ica.GetComponent().c_str(), message, fname.c_str(),
      name_space.GetCString(), exportOld.IsEnabled(), this->Makefile);
  this->Makefile->AddInstallGenerator(exportGenerator);

  return true;
}